

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_ops.cpp
# Opt level: O1

void __thiscall unitOps_inf_Test::~unitOps_inf_Test(unitOps_inf_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(unitOps, inf)
{
    EXPECT_FALSE(isinf(invalid));
    EXPECT_FALSE(isinf(defunit));
    EXPECT_FALSE(isinf(V));
    auto zunit = unit(0.0, m);
    auto nunit = kg / zunit;
    EXPECT_TRUE(isinf(nunit));
    EXPECT_TRUE(isinf(unit_cast(precise_unit(nunit))));
    EXPECT_TRUE(isinf(unit(std::numeric_limits<double>::infinity(), m)));
}